

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O0

int __thiscall helics::Input::getComplexValue(Input *this,double *data,int maxsize)

{
  size_type sVar1;
  int *piVar2;
  complex<double> *__src;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  int length;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *CV;
  Input *in_stack_000000c0;
  int local_28;
  int local_24;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *local_20;
  int local_14;
  void *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_20 = getValueRef<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
                       (in_stack_000000c0);
  local_24 = 0;
  if ((local_10 != (void *)0x0) && (0 < local_14)) {
    sVar1 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                      (local_20);
    local_28 = (int)sVar1;
    piVar2 = CLI::std::min<int>(&local_28,&local_14);
    local_24 = *piVar2;
    __src = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::data
                      ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                       0x38cc83);
    memmove(local_10,__src,(long)local_24 << 4);
  }
  *(undefined1 *)(in_RDI + 0x59) = 0;
  return local_24;
}

Assistant:

int Input::getComplexValue(double* data, int maxsize)
{
    const auto& CV = getValueRef<std::vector<std::complex<double>>>();
    int length = 0;
    if (data != nullptr && maxsize > 0) {
        length = std::min(static_cast<int>(CV.size()), maxsize);
        std::memmove(data, reinterpret_cast<const double*>(CV.data()), length * sizeof(double) * 2);
    }

    hasUpdate = false;
    return length;
}